

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O3

size_t __thiscall CDBWrapper::DynamicMemoryUsage(CDBWrapper *this)

{
  long lVar1;
  DB *pDVar2;
  bool bVar3;
  int iVar4;
  unique_ptr<LevelDBContext,_std::default_delete<LevelDBContext>_> *puVar5;
  Logger *this_00;
  char *__last;
  size_t sVar6;
  long in_FS_OFFSET;
  string_view source_file;
  __integer_from_chars_result_type<unsigned_long> _Var7;
  string_view logging_function;
  char *local_50;
  undefined8 local_48;
  size_t local_40;
  string memory;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memory._M_string_length = 0;
  memory.field_2._M_local_buf[0] = '\0';
  memory._M_dataplus._M_p = (pointer)&memory.field_2;
  puVar5 = inline_assertion_check<true,std::unique_ptr<LevelDBContext,std::default_delete<LevelDBContext>>const&>
                     (&this->m_db_context,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.h"
                      ,0xd3,"DBContext","m_db_context");
  pDVar2 = ((puVar5->_M_t).
            super___uniq_ptr_impl<LevelDBContext,_std::default_delete<LevelDBContext>_>._M_t.
            super__Tuple_impl<0UL,_LevelDBContext_*,_std::default_delete<LevelDBContext>_>.
            super__Head_base<0UL,_LevelDBContext_*,_false>._M_head_impl)->pdb;
  local_50 = "leveldb.approximate-memory-usage";
  local_48 = 0x20;
  iVar4 = (*pDVar2->_vptr_DB[9])(pDVar2,&local_50,&memory);
  if (((char)iVar4 == '\0') ||
     (__last = memory._M_dataplus._M_p + memory._M_string_length,
     _Var7 = std::from_chars<unsigned_long>(memory._M_dataplus._M_p,__last,&local_40,10),
     sVar6 = local_40, _Var7.ptr != __last || _Var7.ec != 0)) {
    this_00 = LogInstance();
    bVar3 = BCLog::Logger::WillLogCategoryLevel(this_00,LEVELDB,Debug);
    if (bVar3) {
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/dbwrapper.cpp"
      ;
      source_file._M_len = 0x5d;
      logging_function._M_str = "DynamicMemoryUsage";
      logging_function._M_len = 0x12;
      LogPrintFormatInternal<>
                (logging_function,source_file,0x139,LEVELDB,Debug,
                 (ConstevalFormatString<0U>)0xf6e4b7);
    }
    sVar6 = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)memory._M_dataplus._M_p != &memory.field_2) {
    operator_delete(memory._M_dataplus._M_p,
                    CONCAT71(memory.field_2._M_allocated_capacity._1_7_,
                             memory.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return sVar6;
}

Assistant:

size_t CDBWrapper::DynamicMemoryUsage() const
{
    std::string memory;
    std::optional<size_t> parsed;
    if (!DBContext().pdb->GetProperty("leveldb.approximate-memory-usage", &memory) || !(parsed = ToIntegral<size_t>(memory))) {
        LogDebug(BCLog::LEVELDB, "Failed to get approximate-memory-usage property\n");
        return 0;
    }
    return parsed.value();
}